

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-equal.c
# Opt level: O2

int run_test_thread_equal(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  uv_thread_t threads [2];
  
  main_thread_id = uv_thread_self();
  iVar1 = uv_thread_equal(&main_thread_id,&main_thread_id);
  if (iVar1 == 0) {
    pcVar2 = "0 != uv_thread_equal(&main_thread_id, &main_thread_id)";
    uStack_20 = 0x26;
  }
  else {
    iVar1 = uv_thread_create(threads,check_thread,subthreads);
    if (iVar1 == 0) {
      iVar1 = uv_thread_create(threads + 1,check_thread,subthreads + 1);
      if (iVar1 == 0) {
        iVar1 = uv_thread_join(threads);
        if (iVar1 == 0) {
          iVar1 = uv_thread_join(threads + 1);
          if (iVar1 == 0) {
            iVar1 = uv_thread_equal(subthreads,subthreads + 1);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar2 = "0 == uv_thread_equal(subthreads + 0, subthreads + 1)";
            uStack_20 = 0x2b;
          }
          else {
            pcVar2 = "0 == uv_thread_join(threads + 1)";
            uStack_20 = 0x2a;
          }
        }
        else {
          pcVar2 = "0 == uv_thread_join(threads + 0)";
          uStack_20 = 0x29;
        }
      }
      else {
        pcVar2 = "0 == uv_thread_create(threads + 1, check_thread, subthreads + 1)";
        uStack_20 = 0x28;
      }
    }
    else {
      pcVar2 = "0 == uv_thread_create(threads + 0, check_thread, subthreads + 0)";
      uStack_20 = 0x27;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(thread_equal) {
  uv_thread_t threads[2];
  main_thread_id = uv_thread_self();
  ASSERT(0 != uv_thread_equal(&main_thread_id, &main_thread_id));
  ASSERT(0 == uv_thread_create(threads + 0, check_thread, subthreads + 0));
  ASSERT(0 == uv_thread_create(threads + 1, check_thread, subthreads + 1));
  ASSERT(0 == uv_thread_join(threads + 0));
  ASSERT(0 == uv_thread_join(threads + 1));
  ASSERT(0 == uv_thread_equal(subthreads + 0, subthreads + 1));
  return 0;
}